

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZManVector<TFad<6,_double>,_3>_>::Resize
          (TPZVec<TPZManVector<TFad<6,_double>,_3>_> *this,int64_t newsize,
          TPZManVector<TFad<6,_double>,_3> *object)

{
  undefined8 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int64_t *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int64_t *piVar8;
  long lVar9;
  TPZManVector<TFad<6,_double>,_3> *pTVar10;
  TPZManVector<TFad<6,_double>,_3> *pTVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar5 = this->fNElements;
  if (lVar5 != newsize) {
    if (newsize == 0) {
      pTVar11 = (TPZManVector<TFad<6,_double>,_3> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0xe0),8) == 0) {
        uVar7 = SUB168(auVar3 * ZEXT816(0xe0),0) | 8;
      }
      piVar4 = (int64_t *)operator_new__(uVar7);
      *piVar4 = newsize;
      pTVar11 = (TPZManVector<TFad<6,_double>,_3> *)(piVar4 + 1);
      lVar6 = 8;
      piVar8 = piVar4;
      do {
        puVar1 = (undefined8 *)((long)piVar4 + lVar6 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)piVar4 + lVar6 + 0x18) = 0;
        *(undefined ***)((long)piVar4 + lVar6) = &PTR__TPZManVector_0189f520;
        lVar9 = 0x30;
        do {
          *(undefined ***)((long)piVar8 + lVar9 + -8) = &PTR__TFad_0185d2b8;
          *(undefined8 *)((long)piVar8 + lVar9) = 0;
          ((undefined8 *)((long)piVar8 + lVar9))[1] = 0;
          puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)piVar8 + lVar9 + 0x30) = 0;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0xf0);
        *(long *)((long)piVar4 + lVar6 + 8) = (long)piVar4 + lVar6 + 0x20;
        lVar9 = lVar6 + 0xe0;
        *(undefined8 *)((long)piVar4 + lVar6 + 0x10) = 0;
        *(undefined8 *)((long)piVar4 + lVar6 + 0x18) = 0;
        piVar8 = piVar8 + 0x1c;
        lVar6 = lVar6 + 0xe0;
      } while ((int64_t *)((long)piVar4 + lVar9) != piVar4 + newsize * 0x1c + 1);
    }
    if (newsize <= lVar5) {
      lVar5 = newsize;
    }
    if (lVar5 < 1) {
      lVar6 = 0;
    }
    else {
      lVar9 = 0;
      lVar6 = 0;
      do {
        TPZManVector<TFad<6,_double>,_3>::operator=
                  ((TPZManVector<TFad<6,_double>,_3> *)
                   ((long)pTVar11->fExtAlloc[0].dx_ + lVar9 + -0x30),
                   (TPZManVector<TFad<6,_double>,_3> *)
                   ((long)this->fStore->fExtAlloc[0].dx_ + lVar9 + -0x30));
        lVar6 = lVar6 + 1;
        lVar9 = lVar9 + 0xe0;
      } while (lVar5 != lVar6);
    }
    lVar5 = newsize - lVar6;
    if (lVar5 != 0 && lVar6 <= newsize) {
      pTVar10 = pTVar11 + lVar6;
      do {
        TPZManVector<TFad<6,_double>,_3>::operator=(pTVar10,object);
        pTVar10 = pTVar10 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pTVar10 = this->fStore;
    if (pTVar10 != (TPZManVector<TFad<6,_double>,_3> *)0x0) {
      dVar2 = pTVar10[-1].fExtAlloc[2].dx_[5];
      if (dVar2 != 0.0) {
        lVar5 = (long)dVar2 * 0xe0;
        do {
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_3> *)
                     ((long)pTVar10[-1].fExtAlloc[0].dx_ + lVar5 + -0x30));
          lVar5 = lVar5 + -0xe0;
        } while (lVar5 != 0);
      }
      operator_delete__(pTVar10[-1].fExtAlloc[2].dx_ + 5,(long)dVar2 * 0xe0 | 8);
      this->fStore = (TPZManVector<TFad<6,_double>,_3> *)0x0;
    }
    this->fStore = pTVar11;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}